

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_BadOneofName_Test::TestBody
          (FeaturesTest_BadOneofName_Test *this)

{
  string_view expected_errors;
  string_view expected_errors_00;
  Metadata MVar1;
  string_view file_name;
  string_view file_name_00;
  string_view file_text;
  string_view file_text_00;
  
  MVar1 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar1.descriptor)->file_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.pool_.enforce_naming_style_ = true;
  expected_errors._M_str = "Oneof name BadOneofName should be lower_snake_case";
  expected_errors._M_len = 0x32;
  file_name._M_str = "naming1.proto";
  file_name._M_len = 0xd;
  file_text._M_str =
       "\n    edition = \"2024\";\n    package naming1;\n    message GoodMessageName { oneof BadOneofName { int32 x = 1; } }\n  "
  ;
  file_text._M_len = 0x72;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            ((ValidationErrorTest *)this,file_name,file_text,expected_errors);
  expected_errors_00._M_str = "Oneof name o_ contains style violating underscores";
  expected_errors_00._M_len = 0x32;
  file_name_00._M_str = "naming2.proto";
  file_name_00._M_len = 0xd;
  file_text_00._M_str =
       "\n      edition = \"2024\";\n      package naming2;\n      message GoodMessageName { oneof o_ { int32 x = 1; } }\n      "
  ;
  file_text_00._M_len = 0x72;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            ((ValidationErrorTest *)this,file_name_00,file_text_00,expected_errors_00);
  return;
}

Assistant:

TEST_F(FeaturesTest, BadOneofName) {
  BuildDescriptorMessagesInTestPool();

  pool_.EnforceNamingStyle(true);

  ParseAndBuildFileWithErrorSubstr(
      "naming1.proto", R"schema(
    edition = "2024";
    package naming1;
    message GoodMessageName { oneof BadOneofName { int32 x = 1; } }
  )schema",
      "Oneof name BadOneofName should be lower_snake_case");

  ParseAndBuildFileWithErrorSubstr(
      "naming2.proto", R"schema(
      edition = "2024";
      package naming2;
      message GoodMessageName { oneof o_ { int32 x = 1; } }
      )schema",
      "Oneof name o_ contains style violating underscores");
}